

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_vk::VkMemoryHeap_*> *fmt)

{
  VkMemoryHeap *value;
  
  std::operator<<(str,"{ ");
  for (value = fmt->begin; value != fmt->end; value = value + 1) {
    if (value != fmt->begin) {
      std::operator<<(str,", ");
    }
    ::vk::operator<<(str,value);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}